

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_set_rtc_external_rc(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int *piVar2;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    piVar2 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    piVar2 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar2 + 2;
  }
  (ctx->ppi->cpi->rc).rtc_external_ratectrl = *piVar2;
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_set_rtc_external_rc(aom_codec_alg_priv_t *ctx,
                                                va_list args) {
  ctx->ppi->cpi->rc.rtc_external_ratectrl =
      CAST(AV1E_SET_RTC_EXTERNAL_RC, args);
  return AOM_CODEC_OK;
}